

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
GoState<9U,_9U>::get_moves
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GoState<9U,_9U> *this)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  int i;
  uint i_00;
  int j;
  int j_00;
  ulong uVar3;
  undefined8 uStack_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->depth < 0x3e9) {
    bVar1 = false;
    uStack_38 = in_RAX;
    for (i_00 = 0; i_00 != 9; i_00 = i_00 + 1) {
      uVar3 = 0;
      while (j_00 = (int)uVar3, j_00 != 9) {
        iVar2 = (*this->_vptr_GoState[6])(this,(ulong)i_00,uVar3,(ulong)(uint)this->player_to_move);
        if ((char)iVar2 != '\0') {
          iVar2 = ij_to_ind(i_00,j_00);
          uStack_38 = CONCAT44(iVar2,(undefined4)uStack_38);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    (__return_storage_ptr__,(int *)((long)&uStack_38 + 4));
        }
        if (!bVar1) {
          iVar2 = (*this->_vptr_GoState[6])
                            (this,(ulong)i_00,uVar3,(ulong)(3 - this->player_to_move));
          if ((char)iVar2 != '\0') {
            bVar1 = true;
          }
        }
        uVar3 = (ulong)(j_00 + 1);
      }
    }
    if (((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_start ==
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish) && (bVar1)) {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&pass);
    }
    return __return_storage_ptr__;
  }
  MCTS::assertion_failed
            ("false",
             "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/go.h"
             ,0x134);
}

Assistant:

virtual std::vector<Move> get_moves() const
	{
		std::vector<Move> moves;
		if (depth > 1000) {
			attest(false);
			return moves;
		}

		bool opponent_has_move = false;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			if (is_move_possible(i, j, player_to_move)) {
				moves.push_back(ij_to_ind(i, j));
			}

			if (!opponent_has_move && is_move_possible(i, j, 3 - player_to_move)) {
				opponent_has_move = true;
			}
		}}

		if (moves.empty() && opponent_has_move) {
			moves.push_back(pass);
		}

		return moves;
	}